

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand.h
# Opt level: O0

void __thiscall
hand::createHand(hand *this,stack<card,_std::deque<card,_std::allocator<card>_>_> *deck)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  card temp;
  stack<card,_std::deque<card,_std::allocator<card>_>_> *deck_local;
  hand *this_local;
  
  temp._40_8_ = deck;
  pvVar3 = std::stack<card,_std::deque<card,_std::allocator<card>_>_>::top(deck);
  card::card((card *)local_48,pvVar3);
  for (local_4c = 0; local_4c < 10; local_4c = local_4c + 1) {
    pvVar3 = std::stack<card,_std::deque<card,_std::allocator<card>_>_>::top
                       ((stack<card,_std::deque<card,_std::allocator<card>_>_> *)temp._40_8_);
    card::operator=((card *)local_48,pvVar3);
    bVar1 = isRegularCard((card *)local_48);
    if (bVar1) {
      uVar2 = getRegularCards(this);
      setRegularCards(this,uVar2 + 1);
    }
    else {
      uVar2 = getSpecialCards(this);
      setSpecialCards(this,uVar2 + 1);
    }
    std::vector<card,_std::allocator<card>_>::push_back(&this->hand_,(value_type *)local_48);
    std::stack<card,_std::deque<card,_std::allocator<card>_>_>::pop
              ((stack<card,_std::deque<card,_std::allocator<card>_>_> *)temp._40_8_);
  }
  card::~card((card *)local_48);
  return;
}

Assistant:

void hand::createHand(stack<card> &deck) {
    card temp = deck.top();
    for(int i = 0; i < START_HAND_QUANTITY; i++) {
        temp = deck.top();
        if (isRegularCard(temp)) setRegularCards(1+getRegularCards());
        else setSpecialCards(1+getSpecialCards());
        hand_.push_back(temp);
        deck.pop();
    }
}